

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

void Cbs2_ManCancelUntil(Cbs2_Man_t *p,int iBound)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  
  iVar2 = (p->pProp).iTail;
  if (iVar2 < iBound) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x228,"void Cbs2_ManCancelUntil(Cbs2_Man_t *, int)");
  }
  (p->pProp).iHead = iBound;
  if (iBound < iVar2) {
    lVar4 = (long)iBound;
    do {
      uVar5 = (p->pProp).pData[lVar4];
      if (uVar5 == 0) break;
      if ((int)uVar5 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar5 = uVar5 >> 1;
      if ((p->vAssign).nSize <= (int)uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      pcVar3 = (p->vAssign).pArray;
      cVar1 = pcVar3[uVar5];
      if ('\x01' < cVar1) {
        __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x85,"void Cbs2_VarUnassign(Cbs2_Man_t *, int)");
      }
      pcVar3[uVar5] = cVar1 + '\x02';
      if ((p->vLevReason).nSize <= (int)(uVar5 * 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vLevReason).pArray[uVar5 * 3] = -1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->pProp).iTail);
  }
  (p->pProp).iTail = iBound;
  return;
}

Assistant:

static inline void Cbs2_ManCancelUntil( Cbs2_Man_t * p, int iBound )
{
    int i, iLit;
    assert( iBound <= p->pProp.iTail );
    p->pProp.iHead = iBound;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
        Cbs2_VarUnassign( p, Abc_Lit2Var(iLit) );
    p->pProp.iTail = iBound;
}